

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O0

void __thiscall
icu_63::FieldPositionIteratorHandler::FieldPositionIteratorHandler
          (FieldPositionIteratorHandler *this,FieldPositionIterator *posIter,UErrorCode *_status)

{
  UBool UVar1;
  UVector32 *this_00;
  FieldPositionIterator *size;
  UVector32 *local_58;
  UErrorCode *_status_local;
  FieldPositionIterator *posIter_local;
  FieldPositionIteratorHandler *this_local;
  
  size = posIter;
  FieldPositionHandler::FieldPositionHandler(&this->super_FieldPositionHandler);
  (this->super_FieldPositionHandler)._vptr_FieldPositionHandler =
       (_func_int **)&PTR__FieldPositionIteratorHandler_004e0af0;
  this->iter = posIter;
  this->vec = (UVector32 *)0x0;
  this->status = *_status;
  if (this->iter != (FieldPositionIterator *)0x0) {
    UVar1 = ::U_SUCCESS(this->status);
    if (UVar1 != '\0') {
      this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
      local_58 = (UVector32 *)0x0;
      if (this_00 != (UVector32 *)0x0) {
        UVector32::UVector32(this_00,&this->status);
        local_58 = this_00;
      }
      this->vec = local_58;
    }
  }
  return;
}

Assistant:

FieldPositionIteratorHandler::FieldPositionIteratorHandler(FieldPositionIterator* posIter,
                                                           UErrorCode& _status)
    : iter(posIter), vec(NULL), status(_status) {
  if (iter && U_SUCCESS(status)) {
    vec = new UVector32(status);
  }
}